

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.h
# Opt level: O1

void __thiscall
ExprError::ExprError
          (ExprError *this,Allocator *allocator,SynBase *source,TypeBase *type,
          ArrayView<ExprBase_*> arr)

{
  uint uVar1;
  ExprBase **ppEVar2;
  ExprBase *pEVar3;
  ulong uVar4;
  
  (this->super_ExprBase).typeID = 0;
  (this->super_ExprBase).source = source;
  (this->super_ExprBase).type = type;
  (this->super_ExprBase).next = (ExprBase *)0x0;
  (this->super_ExprBase).listed = false;
  (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprError_00229b38;
  (this->values).allocator = allocator;
  (this->values).data = (this->values).little;
  (this->values).count = 0;
  (this->values).max = 4;
  if (arr.count != 0) {
    uVar4 = 0;
    do {
      uVar1 = (this->values).count;
      if (uVar1 == (this->values).max) {
        SmallArray<ExprBase_*,_4U>::grow(&this->values,uVar1);
      }
      ppEVar2 = (this->values).data;
      if (ppEVar2 == (ExprBase **)0x0) {
        __assert_fail("data",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x162,
                      "void SmallArray<ExprBase *, 4>::push_back(const T &) [T = ExprBase *, N = 4]"
                     );
      }
      pEVar3 = arr.data[uVar4];
      uVar1 = (this->values).count;
      (this->values).count = uVar1 + 1;
      ppEVar2[uVar1] = pEVar3;
      uVar4 = uVar4 + 1;
    } while (arr.count != uVar4);
  }
  return;
}

Assistant:

ExprBase(unsigned typeID, SynBase *source, TypeBase *type): typeID(typeID), source(source), type(type), next(0), listed(false)
	{
	}